

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cpp
# Opt level: O0

void __thiscall xscript::tokenizer::scanner::step_to_eonb(scanner *this)

{
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  char n;
  scanner *this_local;
  
  while( true ) {
    uVar1 = this->offset;
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::length(&this->source);
    if (sVar2 <= uVar1) {
      return;
    }
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::at(&this->source,this->offset);
    if (*pvVar3 < '0') break;
    if ('1' < *pvVar3) {
      return;
    }
    this->offset = this->offset + 1;
  }
  return;
}

Assistant:

void scanner::step_to_eonb() {
    while (offset < source.length()) {
        char n = source.at(offset);
        if ( n >= '0' && n <= '1' ) {
            offset++;
        } else {
            break;
        }
    }
}